

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::DecimalQuantity::readDecNumberToBcd(DecimalQuantity *this,DecNum *decnum)

{
  decNumber *pdVar1;
  int local_34;
  ulong uStack_30;
  int32_t i_1;
  uint64_t result;
  int32_t i;
  decNumber *dn;
  DecNum *decnum_local;
  DecimalQuantity *this_local;
  
  pdVar1 = DecNum::getRawDecNumber(decnum);
  if (pdVar1->digits < 0x11) {
    uStack_30 = 0;
    for (local_34 = 0; local_34 < pdVar1->digits; local_34 = local_34 + 1) {
      uStack_30 = (ulong)pdVar1->lsu[local_34] << ((byte)(local_34 << 2) & 0x3f) | uStack_30;
    }
    (this->fBCD).bcdLong = uStack_30;
  }
  else {
    ensureCapacity(this,pdVar1->digits);
    for (result._4_4_ = 0; result._4_4_ < pdVar1->digits; result._4_4_ = result._4_4_ + 1) {
      (this->fBCD).bcdBytes.ptr[result._4_4_] = pdVar1->lsu[result._4_4_];
    }
  }
  this->scale = pdVar1->exponent;
  this->precision = pdVar1->digits;
  return;
}

Assistant:

void DecimalQuantity::readDecNumberToBcd(const DecNum& decnum) {
    const decNumber* dn = decnum.getRawDecNumber();
    if (dn->digits > 16) {
        ensureCapacity(dn->digits);
        for (int32_t i = 0; i < dn->digits; i++) {
            fBCD.bcdBytes.ptr[i] = dn->lsu[i];
        }
    } else {
        uint64_t result = 0L;
        for (int32_t i = 0; i < dn->digits; i++) {
            result |= static_cast<uint64_t>(dn->lsu[i]) << (4 * i);
        }
        fBCD.bcdLong = result;
    }
    scale = dn->exponent;
    precision = dn->digits;
}